

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewSymbolTreeVisitor.cpp
# Opt level: O2

void __thiscall
NewSymbolTreeVisitor::PreVisit(NewSymbolTreeVisitor *this,VariableDeclaration *variable_declaration)

{
  symbol_table_t *this_00;
  member_table_t *this_01;
  Type *pTVar1;
  _Hashtable<Symbol,_std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_std::hash<Symbol>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this_02;
  iterator iVar2;
  mapped_type *pmVar3;
  _Map_base<Symbol,_std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_std::hash<Symbol>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *this_03;
  mapped_type *pmVar4;
  _Hashtable<Symbol,_Symbol,_std::allocator<Symbol>,_std::__detail::_Identity,_std::equal_to<Symbol>,_std::hash<Symbol>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *this_04;
  iterator iVar5;
  _Insert_base<Symbol,_Symbol,_std::allocator<Symbol>,_std::__detail::_Identity,_std::equal_to<Symbol>,_std::hash<Symbol>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *this_05;
  runtime_error *prVar6;
  Symbol *__k;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  Symbol symbol;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveArrayObject>_>
  local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string((string *)&local_50,(string *)&variable_declaration->variable_name_);
  Symbol::Symbol(&symbol,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  this_00 = &(this->tree_).class_symbols_table_;
  __k = &this->current_layer_->class_symbol_;
  if ((variable_declaration->type_->type_name_)._M_dataplus._M_p
      [(variable_declaration->type_->type_name_)._M_string_length - 1] == ']') {
    this_02 = (_Hashtable<Symbol,_std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_std::hash<Symbol>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               *)std::__detail::_Map_base<$a1ab393$>::operator[]
                           ((_Map_base<_a1ab393_> *)this_00,__k);
    iVar2 = std::
            _Hashtable<Symbol,_std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_std::hash<Symbol>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(this_02,&symbol);
    std::__detail::_Map_base<$a1ab393$>::operator[]
              ((_Map_base<_a1ab393_> *)this_00,&this->current_layer_->class_symbol_);
    if (iVar2.
        super__Node_iterator_base<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>,_true>
        ._M_cur != (__node_type *)0x0) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      Symbol::GetName_abi_cxx11_(&local_b0,&this->current_layer_->class_symbol_);
      std::operator+(&local_90,"In class ",&local_b0);
      std::operator+(&local_d0,&local_90," array ");
      Symbol::GetName_abi_cxx11_(&local_70,&symbol);
      std::operator+(&local_140,&local_d0,&local_70);
      std::operator+(&local_100.first,&local_140," has been already declared!");
      std::runtime_error::runtime_error(prVar6,(string *)&local_100);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pTVar1 = variable_declaration->type_;
    if (pTVar1 == (Type *)0x0) {
      local_d0._M_dataplus._M_p = (pointer)0x0;
    }
    else {
      local_d0._M_dataplus._M_p =
           (pointer)__dynamic_cast(pTVar1,&Type::typeinfo,&ArrayType::typeinfo,0);
    }
    std::make_shared<PrimitiveArrayObject,ArrayType*>((ArrayType **)&local_140);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveArrayObject>_>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::shared_ptr<PrimitiveArrayObject>,_true>
              (&local_100,&pTVar1->type_name_,(shared_ptr<PrimitiveArrayObject> *)&local_140);
    this_03 = (_Map_base<Symbol,_std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_std::hash<Symbol>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               *)std::__detail::_Map_base<$a1ab393$>::operator[]
                           ((_Map_base<_a1ab393_> *)this_00,&this->current_layer_->class_symbol_);
    pmVar4 = std::__detail::
             _Map_base<Symbol,_std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_std::hash<Symbol>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[](this_03,&symbol);
    std::pair<std::__cxx11::string,std::shared_ptr<PrimitiveObject>>::operator=
              ((pair<std::__cxx11::string,std::shared_ptr<PrimitiveObject>> *)pmVar4,&local_100);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveArrayObject>_>
    ::~pair(&local_100);
  }
  else {
    pmVar3 = std::__detail::_Map_base<$a1ab393$>::operator[]((_Map_base<_a1ab393_> *)this_00,__k);
    iVar2 = std::
            _Hashtable<Symbol,_std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_std::hash<Symbol>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find((_Hashtable<Symbol,_std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_std::hash<Symbol>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)&(pmVar3->
                       super__Tuple_impl<0UL,_std::unordered_map<Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>_>,_std::unordered_map<Symbol,_std::shared_ptr<Method>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Method>_>_>_>,_std::unordered_map<Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>_>_>
                       ).
                       super__Head_base<0UL,_std::unordered_map<Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>_>,_false>
                   ,&symbol);
    std::__detail::_Map_base<$a1ab393$>::operator[]
              ((_Map_base<_a1ab393_> *)this_00,&this->current_layer_->class_symbol_);
    if (iVar2.
        super__Node_iterator_base<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>,_true>
        ._M_cur != (__node_type *)0x0) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      Symbol::GetName_abi_cxx11_(&local_b0,&this->current_layer_->class_symbol_);
      std::operator+(&local_90,"In class ",&local_b0);
      std::operator+(&local_d0,&local_90," variable ");
      Symbol::GetName_abi_cxx11_(&local_70,&symbol);
      std::operator+(&local_140,&local_d0,&local_70);
      std::operator+(&local_100.first,&local_140," has been already declared!");
      std::runtime_error::runtime_error(prVar6,(string *)&local_100);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pTVar1 = variable_declaration->type_;
    std::make_shared<PrimitiveSimpleObject,Type*&>((Type **)&local_140);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveSimpleObject>_>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::shared_ptr<PrimitiveSimpleObject>,_true>
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveSimpleObject>_>
                *)&local_100,&pTVar1->type_name_,(shared_ptr<PrimitiveSimpleObject> *)&local_140);
    pmVar3 = std::__detail::_Map_base<$a1ab393$>::operator[]
                       ((_Map_base<_a1ab393_> *)this_00,&this->current_layer_->class_symbol_);
    pmVar4 = std::__detail::
             _Map_base<Symbol,_std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_std::hash<Symbol>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<Symbol,_std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_std::hash<Symbol>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&(pmVar3->
                              super__Tuple_impl<0UL,_std::unordered_map<Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>_>,_std::unordered_map<Symbol,_std::shared_ptr<Method>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Method>_>_>_>,_std::unordered_map<Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>_>_>
                              ).
                              super__Head_base<0UL,_std::unordered_map<Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>_>,_false>
                          ,&symbol);
    std::pair<std::__cxx11::string,std::shared_ptr<PrimitiveObject>>::operator=
              ((pair<std::__cxx11::string,std::shared_ptr<PrimitiveObject>> *)pmVar4,
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveSimpleObject>_>
                *)&local_100);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveSimpleObject>_>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveSimpleObject>_>
             *)&local_100);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_140._M_string_length);
  this_01 = &(this->tree_).class_members_table_;
  this_04 = &std::__detail::
             _Map_base<Symbol,_std::pair<const_Symbol,_std::unordered_set<Symbol,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<Symbol>_>_>,_std::allocator<std::pair<const_Symbol,_std::unordered_set<Symbol,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<Symbol>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_std::hash<Symbol>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<Symbol,_std::pair<const_Symbol,_std::unordered_set<Symbol,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<Symbol>_>_>,_std::allocator<std::pair<const_Symbol,_std::unordered_set<Symbol,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<Symbol>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_std::hash<Symbol>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)this_01,&this->current_layer_->class_symbol_)->_M_h;
  iVar5 = std::
          _Hashtable<Symbol,_Symbol,_std::allocator<Symbol>,_std::__detail::_Identity,_std::equal_to<Symbol>,_std::hash<Symbol>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::find(this_04,&symbol);
  std::__detail::
  _Map_base<Symbol,_std::pair<const_Symbol,_std::unordered_set<Symbol,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<Symbol>_>_>,_std::allocator<std::pair<const_Symbol,_std::unordered_set<Symbol,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<Symbol>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_std::hash<Symbol>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  ::operator[]((_Map_base<Symbol,_std::pair<const_Symbol,_std::unordered_set<Symbol,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<Symbol>_>_>,_std::allocator<std::pair<const_Symbol,_std::unordered_set<Symbol,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<Symbol>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_std::hash<Symbol>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                *)this_01,&this->current_layer_->class_symbol_);
  if (iVar5.super__Node_iterator_base<Symbol,_true>._M_cur == (__node_type *)0x0) {
    this_05 = (_Insert_base<Symbol,_Symbol,_std::allocator<Symbol>,_std::__detail::_Identity,_std::equal_to<Symbol>,_std::hash<Symbol>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
               *)std::__detail::
                 _Map_base<Symbol,_std::pair<const_Symbol,_std::unordered_set<Symbol,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<Symbol>_>_>,_std::allocator<std::pair<const_Symbol,_std::unordered_set<Symbol,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<Symbol>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_std::hash<Symbol>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<Symbol,_std::pair<const_Symbol,_std::unordered_set<Symbol,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<Symbol>_>_>,_std::allocator<std::pair<const_Symbol,_std::unordered_set<Symbol,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<Symbol>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_std::hash<Symbol>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)this_01,&this->current_layer_->class_symbol_);
    std::__detail::
    _Insert_base<Symbol,_Symbol,_std::allocator<Symbol>,_std::__detail::_Identity,_std::equal_to<Symbol>,_std::hash<Symbol>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::insert(this_05,&symbol);
    std::__cxx11::string::~string((string *)&symbol);
    return;
  }
  prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
  Symbol::GetName_abi_cxx11_(&local_90,&this->current_layer_->class_symbol_);
  std::operator+(&local_d0,"In class ",&local_90);
  std::operator+(&local_140,&local_d0," member duplicate: ");
  Symbol::GetName_abi_cxx11_(&local_b0,&symbol);
  std::operator+(&local_100.first,&local_140,&local_b0);
  std::runtime_error::runtime_error(prVar6,(string *)&local_100);
  __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void NewSymbolTreeVisitor::PreVisit(VariableDeclaration* variable_declaration) {
  Symbol symbol(variable_declaration->variable_name_);
  if (variable_declaration->type_->type_name_.back() != ']') {
    if (std::get<0>(tree_.class_symbols_table_[current_layer_->class_symbol_])
            .find(symbol) !=
        std::get<0>(tree_.class_symbols_table_[current_layer_->class_symbol_])
            .end()) {
      throw std::runtime_error(
          "In class " + current_layer_->class_symbol_.GetName() + " variable " +
          symbol.GetName() + " has been already declared!");
    }

    std::get<0>(
        tree_.class_symbols_table_[current_layer_->class_symbol_])[symbol] =
        std::make_pair(variable_declaration->type_->type_name_,
                       std::make_shared<PrimitiveSimpleObject>(variable_declaration->type_));
  } else {
    if (std::get<2>(tree_.class_symbols_table_[current_layer_->class_symbol_])
            .find(symbol) !=
        std::get<2>(tree_.class_symbols_table_[current_layer_->class_symbol_])
            .end()) {
      throw std::runtime_error(
          "In class " + current_layer_->class_symbol_.GetName() + " array " +
          symbol.GetName() + " has been already declared!");
    }

    std::get<2>(
        tree_.class_symbols_table_[current_layer_->class_symbol_])[symbol] =
        std::make_pair(variable_declaration->type_->type_name_,
                       std::make_shared<PrimitiveArrayObject>(dynamic_cast<ArrayType*>(variable_declaration->type_)));
  }

  if (tree_.class_members_table_[current_layer_->class_symbol_].find(symbol) !=
      tree_.class_members_table_[current_layer_->class_symbol_].end()) {
    throw std::runtime_error("In class " +
                             current_layer_->class_symbol_.GetName() +
                             " member duplicate: " + symbol.GetName());
  }
  tree_.class_members_table_[current_layer_->class_symbol_].insert(symbol);
}